

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int vdbeMemAddTerminator(Mem *pMem)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = sqlite3VdbeMemGrow(pMem,pMem->n + 3,1);
  iVar3 = 7;
  if (iVar2 == 0) {
    iVar3 = 0;
    pMem->z[pMem->n] = '\0';
    pMem->z[(long)pMem->n + 1] = '\0';
    pMem->z[(long)pMem->n + 2] = '\0';
    pbVar1 = (byte *)((long)&pMem->flags + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  return iVar3;
}

Assistant:

static SQLITE_NOINLINE int vdbeMemAddTerminator(Mem *pMem){
  if( sqlite3VdbeMemGrow(pMem, pMem->n+3, 1) ){
    return SQLITE_NOMEM_BKPT;
  }
  pMem->z[pMem->n] = 0;
  pMem->z[pMem->n+1] = 0;
  pMem->z[pMem->n+2] = 0;
  pMem->flags |= MEM_Term;
  return SQLITE_OK;
}